

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8_fp16.h
# Opt level: O1

void ncnn::conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx
               (Mat *kernel,Mat *weight_data_pack8,int num_input,int num_output)

{
  size_t sVar1;
  unsigned_short uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  unsigned_short *puVar18;
  void *pvVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  void *pvVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  void *pvVar72;
  long lVar73;
  void *pvVar74;
  long lVar75;
  void *pvVar76;
  Mat weight_data_r2;
  void *local_310;
  void *local_308;
  void *local_300;
  long local_2f8;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,1,num_input,num_output,(Allocator *)0x0);
  iVar6 = num_input + 7;
  if (-1 < num_input) {
    iVar6 = num_input;
  }
  iVar3 = num_output + 7;
  if (-1 < num_output) {
    iVar3 = num_output;
  }
  Mat::create(weight_data_pack8,1,iVar6 >> 3,iVar3 >> 3,0x80,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    local_2b0 = 1;
    local_2b8 = 2;
    local_2c0 = 3;
    local_2c8 = 4;
    local_2d0 = 5;
    local_2d8 = 6;
    local_2e0 = 7;
    local_2e8 = 0;
    local_2f8 = 0;
    do {
      if (7 < num_input) {
        lVar7 = (long)local_78.w;
        lVar44 = local_78.cstep * local_2f8;
        lVar8 = lVar7 * 7;
        lVar20 = (lVar44 + lVar8) * local_78.elemsize;
        lVar45 = local_78.cstep * local_2b0;
        lVar21 = (lVar45 + lVar8) * local_78.elemsize;
        lVar46 = local_78.cstep * local_2b8;
        lVar22 = (lVar46 + lVar8) * local_78.elemsize;
        lVar47 = local_78.cstep * local_2c0;
        lVar23 = (lVar47 + lVar8) * local_78.elemsize;
        lVar17 = local_78.cstep * local_2c8;
        lVar24 = (lVar17 + lVar8) * local_78.elemsize;
        lVar73 = local_78.cstep * local_2d0;
        lVar4 = (lVar8 + lVar73) * local_78.elemsize;
        lVar75 = local_78.cstep * local_2d8;
        lVar5 = (long)local_78.w;
        lVar48 = (lVar75 + lVar5 * 7) * local_78.elemsize;
        lVar43 = local_78.cstep * local_2e0;
        lVar25 = (lVar5 * 7 + lVar43) * local_78.elemsize;
        lVar26 = (lVar44 + lVar7) * local_78.elemsize;
        lVar27 = (lVar45 + lVar7) * local_78.elemsize;
        lVar28 = (lVar46 + lVar7) * local_78.elemsize;
        lVar29 = (lVar47 + lVar7) * local_78.elemsize;
        lVar30 = (lVar17 + lVar7) * local_78.elemsize;
        lVar31 = (lVar73 + lVar7) * local_78.elemsize;
        lVar32 = (lVar75 + lVar5) * local_78.elemsize;
        lVar33 = (lVar43 + lVar5) * local_78.elemsize;
        lVar34 = (lVar44 + lVar7 * 2) * local_78.elemsize;
        lVar35 = (lVar45 + lVar7 * 2) * local_78.elemsize;
        lVar36 = (lVar46 + lVar7 * 2) * local_78.elemsize;
        lVar37 = (lVar47 + lVar7 * 2) * local_78.elemsize;
        lVar38 = (lVar17 + lVar7 * 2) * local_78.elemsize;
        lVar39 = (lVar73 + lVar7 * 2) * local_78.elemsize;
        lVar40 = (lVar75 + lVar5 * 2) * local_78.elemsize;
        lVar41 = (lVar43 + lVar5 * 2) * local_78.elemsize;
        lVar8 = lVar7 * 3;
        lVar49 = (lVar44 + lVar8) * local_78.elemsize;
        lVar50 = (lVar45 + lVar8) * local_78.elemsize;
        lVar51 = (lVar46 + lVar8) * local_78.elemsize;
        lVar52 = (lVar47 + lVar8) * local_78.elemsize;
        lVar53 = (lVar17 + lVar8) * local_78.elemsize;
        lVar54 = (lVar73 + lVar8) * local_78.elemsize;
        lVar65 = (lVar75 + lVar5 * 3) * local_78.elemsize;
        lVar55 = (lVar5 * 3 + lVar43) * local_78.elemsize;
        lVar56 = (lVar44 + lVar7 * 4) * local_78.elemsize;
        lVar57 = (lVar45 + lVar7 * 4) * local_78.elemsize;
        lVar58 = (lVar46 + lVar7 * 4) * local_78.elemsize;
        lVar59 = (lVar47 + lVar7 * 4) * local_78.elemsize;
        lVar60 = (lVar17 + lVar7 * 4) * local_78.elemsize;
        lVar61 = (lVar73 + lVar7 * 4) * local_78.elemsize;
        lVar62 = (lVar75 + lVar5 * 4) * local_78.elemsize;
        lVar63 = (lVar43 + lVar5 * 4) * local_78.elemsize;
        lVar8 = lVar7 * 5;
        lVar66 = (lVar44 + lVar8) * local_78.elemsize;
        lVar67 = (lVar45 + lVar8) * local_78.elemsize;
        lVar68 = (lVar46 + lVar8) * local_78.elemsize;
        lVar69 = (lVar47 + lVar8) * local_78.elemsize;
        lVar70 = (lVar17 + lVar8) * local_78.elemsize;
        lVar8 = (lVar8 + lVar73) * local_78.elemsize;
        lVar71 = (lVar75 + lVar5 * 5) * local_78.elemsize;
        lVar9 = (lVar5 * 5 + lVar43) * local_78.elemsize;
        lVar10 = (lVar44 + lVar7 * 6) * local_78.elemsize;
        lVar11 = (lVar45 + lVar7 * 6) * local_78.elemsize;
        lVar12 = (lVar46 + lVar7 * 6) * local_78.elemsize;
        lVar13 = (lVar47 + lVar7 * 6) * local_78.elemsize;
        lVar14 = (lVar17 + lVar7 * 6) * local_78.elemsize;
        lVar15 = (lVar73 + lVar7 * 6) * local_78.elemsize;
        lVar42 = (lVar75 + lVar5 * 6) * local_78.elemsize;
        lVar16 = (lVar5 * 6 + lVar43) * local_78.elemsize;
        lVar44 = lVar44 * local_78.elemsize;
        lVar46 = lVar46 * local_78.elemsize;
        lVar47 = lVar47 * local_78.elemsize;
        lVar17 = lVar17 * local_78.elemsize;
        lVar73 = lVar73 * local_78.elemsize;
        lVar75 = lVar75 * local_78.elemsize;
        lVar43 = lVar43 * local_78.elemsize;
        lVar45 = lVar45 * local_78.elemsize;
        sVar1 = weight_data_pack8->elemsize;
        puVar18 = (unsigned_short *)
                  ((long)weight_data_pack8->data +
                  weight_data_pack8->cstep * sVar1 * local_2e8 + 0x7e);
        iVar6 = weight_data_pack8->w;
        lVar7 = local_78.elemsize * lVar7 * 8;
        lVar5 = local_78.elemsize * lVar5 * 8;
        iVar3 = 7;
        local_310 = local_78.data;
        local_308 = local_78.data;
        local_300 = local_78.data;
        pvVar19 = local_78.data;
        pvVar64 = local_78.data;
        pvVar72 = local_78.data;
        pvVar74 = local_78.data;
        pvVar76 = local_78.data;
        do {
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar44));
          puVar18[-0x3f] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar45));
          puVar18[-0x3e] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar46));
          puVar18[-0x3d] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar47));
          puVar18[-0x3c] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar17));
          puVar18[-0x3b] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar73));
          puVar18[-0x3a] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar75));
          puVar18[-0x39] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar43));
          puVar18[-0x38] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar26));
          puVar18[-0x37] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar27));
          puVar18[-0x36] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar28));
          puVar18[-0x35] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar29));
          puVar18[-0x34] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar30));
          puVar18[-0x33] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar31));
          puVar18[-0x32] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar32));
          puVar18[-0x31] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar33));
          puVar18[-0x30] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar34));
          puVar18[-0x2f] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar35));
          puVar18[-0x2e] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar36));
          puVar18[-0x2d] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar37));
          puVar18[-0x2c] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar38));
          puVar18[-0x2b] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar39));
          puVar18[-0x2a] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar40));
          puVar18[-0x29] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar41));
          puVar18[-0x28] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar49));
          puVar18[-0x27] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar50));
          puVar18[-0x26] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar51));
          puVar18[-0x25] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar52));
          puVar18[-0x24] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar53));
          puVar18[-0x23] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar54));
          puVar18[-0x22] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar65));
          puVar18[-0x21] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar55));
          puVar18[-0x20] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar56));
          puVar18[-0x1f] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar57));
          puVar18[-0x1e] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar58));
          puVar18[-0x1d] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar59));
          puVar18[-0x1c] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar60));
          puVar18[-0x1b] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar61));
          puVar18[-0x1a] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar62));
          puVar18[-0x19] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar63));
          puVar18[-0x18] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar66));
          puVar18[-0x17] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar67));
          puVar18[-0x16] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar68));
          puVar18[-0x15] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar69));
          puVar18[-0x14] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar70));
          puVar18[-0x13] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar8));
          puVar18[-0x12] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar71));
          puVar18[-0x11] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar9));
          puVar18[-0x10] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar10));
          puVar18[-0xf] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar11));
          puVar18[-0xe] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar12));
          puVar18[-0xd] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar13));
          puVar18[-0xc] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar14));
          puVar18[-0xb] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar15));
          puVar18[-10] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar42));
          puVar18[-9] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar16));
          puVar18[-8] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar19 + lVar20));
          puVar18[-7] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar64 + lVar21));
          puVar18[-6] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar76 + lVar22));
          puVar18[-5] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar74 + lVar23));
          puVar18[-4] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_300 + lVar24));
          puVar18[-3] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_308 + lVar4));
          puVar18[-2] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)local_310 + lVar48));
          puVar18[-1] = uVar2;
          uVar2 = float32_to_float16(*(float *)((long)pvVar72 + lVar25));
          *puVar18 = uVar2;
          pvVar19 = (void *)((long)pvVar19 + lVar7);
          pvVar64 = (void *)((long)pvVar64 + lVar7);
          pvVar76 = (void *)((long)pvVar76 + lVar7);
          pvVar74 = (void *)((long)pvVar74 + lVar7);
          local_300 = (void *)((long)local_300 + lVar7);
          local_308 = (void *)((long)local_308 + lVar7);
          local_310 = (void *)((long)local_310 + lVar5);
          pvVar72 = (void *)((long)pvVar72 + lVar5);
          puVar18 = (unsigned_short *)((long)puVar18 + (long)iVar6 * sVar1);
          iVar3 = iVar3 + 8;
        } while (iVar3 < num_input);
      }
      local_2f8 = local_2f8 + 8;
      local_2b0 = local_2b0 + 8;
      local_2b8 = local_2b8 + 8;
      local_2c0 = local_2c0 + 8;
      local_2c8 = local_2c8 + 8;
      local_2d0 = local_2d0 + 8;
      local_2d8 = local_2d8 + 8;
      local_2e0 = local_2e0 + 8;
      local_2e8 = local_2e8 + 1;
    } while ((int)((uint)local_2f8 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_fp16_pack8_avx(const Mat& kernel, Mat& weight_data_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(1, num_input, num_output);

    weight_data_pack8.create(1, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = weight_data_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);
            g00[0] = float32_to_float16(k00[0]);
            g00[1] = float32_to_float16(k10[0]);
            g00[2] = float32_to_float16(k20[0]);
            g00[3] = float32_to_float16(k30[0]);
            g00[4] = float32_to_float16(k40[0]);
            g00[5] = float32_to_float16(k50[0]);
            g00[6] = float32_to_float16(k60[0]);
            g00[7] = float32_to_float16(k70[0]);
            g00 += 8;
            g00[0] = float32_to_float16(k01[0]);
            g00[1] = float32_to_float16(k11[0]);
            g00[2] = float32_to_float16(k21[0]);
            g00[3] = float32_to_float16(k31[0]);
            g00[4] = float32_to_float16(k41[0]);
            g00[5] = float32_to_float16(k51[0]);
            g00[6] = float32_to_float16(k61[0]);
            g00[7] = float32_to_float16(k71[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k02[0]);
            g00[1] = float32_to_float16(k12[0]);
            g00[2] = float32_to_float16(k22[0]);
            g00[3] = float32_to_float16(k32[0]);
            g00[4] = float32_to_float16(k42[0]);
            g00[5] = float32_to_float16(k52[0]);
            g00[6] = float32_to_float16(k62[0]);
            g00[7] = float32_to_float16(k72[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k03[0]);
            g00[1] = float32_to_float16(k13[0]);
            g00[2] = float32_to_float16(k23[0]);
            g00[3] = float32_to_float16(k33[0]);
            g00[4] = float32_to_float16(k43[0]);
            g00[5] = float32_to_float16(k53[0]);
            g00[6] = float32_to_float16(k63[0]);
            g00[7] = float32_to_float16(k73[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k04[0]);
            g00[1] = float32_to_float16(k14[0]);
            g00[2] = float32_to_float16(k24[0]);
            g00[3] = float32_to_float16(k34[0]);
            g00[4] = float32_to_float16(k44[0]);
            g00[5] = float32_to_float16(k54[0]);
            g00[6] = float32_to_float16(k64[0]);
            g00[7] = float32_to_float16(k74[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k05[0]);
            g00[1] = float32_to_float16(k15[0]);
            g00[2] = float32_to_float16(k25[0]);
            g00[3] = float32_to_float16(k35[0]);
            g00[4] = float32_to_float16(k45[0]);
            g00[5] = float32_to_float16(k55[0]);
            g00[6] = float32_to_float16(k65[0]);
            g00[7] = float32_to_float16(k75[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k06[0]);
            g00[1] = float32_to_float16(k16[0]);
            g00[2] = float32_to_float16(k26[0]);
            g00[3] = float32_to_float16(k36[0]);
            g00[4] = float32_to_float16(k46[0]);
            g00[5] = float32_to_float16(k56[0]);
            g00[6] = float32_to_float16(k66[0]);
            g00[7] = float32_to_float16(k76[0]);

            g00 += 8;
            g00[0] = float32_to_float16(k07[0]);
            g00[1] = float32_to_float16(k17[0]);
            g00[2] = float32_to_float16(k27[0]);
            g00[3] = float32_to_float16(k37[0]);
            g00[4] = float32_to_float16(k47[0]);
            g00[5] = float32_to_float16(k57[0]);
            g00[6] = float32_to_float16(k67[0]);
            g00[7] = float32_to_float16(k77[0]);

            g00 += 8;
        }
    }
}